

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  CURLcode local_34;
  CURLcode result;
  _Bool *protocol_done_local;
  _Bool *asyncp_local;
  connectdata **in_connect_local;
  Curl_easy *data_local;
  
  *asyncp = false;
  Curl_free_request_state(data);
  memset(&data->req,0,0x5a0);
  (data->req).maxdownload = -1;
  local_34 = create_conn(data,in_connect,asyncp);
  if (local_34 == CURLE_OK) {
    if (((*in_connect)->send_pipe).size + ((*in_connect)->recv_pipe).size == 0) {
      if ((*asyncp & 1U) == 0) {
        local_34 = Curl_setup_conn(*in_connect,protocol_done);
      }
    }
    else {
      *protocol_done = true;
    }
  }
  if (local_34 == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = (connectdata *)0x0;
  }
  else if ((local_34 != CURLE_OK) && (*in_connect != (connectdata *)0x0)) {
    Curl_disconnect(data,*in_connect,true);
    *in_connect = (connectdata *)0x0;
  }
  return local_34;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    if(CONN_INUSE(*in_connect))
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }
  else if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, *in_connect, TRUE);
    *in_connect = NULL; /* return a NULL */
  }

  return result;
}